

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeTuple<unsigned_long,4ul>
          (AsciiParser *this,array<unsigned_long,_4UL> *result)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ulong local_108;
  size_t i;
  __cxx11 local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  undefined1 local_60 [8];
  string msg;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  array<unsigned_long,_4UL> *result_local;
  AsciiParser *this_local;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = result->_M_elems;
  bVar2 = Expect(this,'(');
  if (bVar2) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
    bVar2 = SepBy1BasicType<unsigned_long>
                      (this,',',(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
    if (bVar2) {
      bVar2 = Expect(this,')');
      if (bVar2) {
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
        if (sVar3 == 4) {
          for (local_108 = 0; local_108 < 4; local_108 = local_108 + 1) {
            pvVar4 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                local_108);
            vVar1 = *pvVar4;
            pvVar5 = ::std::array<unsigned_long,_4UL>::operator[]
                               ((array<unsigned_long,_4UL> *)
                                values.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_108);
            *pvVar5 = vVar1;
          }
          this_local._7_1_ = true;
          msg.field_2._12_4_ = 1;
        }
        else {
          std::__cxx11::to_string(local_e0,4);
          ::std::operator+((char *)local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "The number of tuple elements must be ");
          ::std::operator+(local_a0,(char *)local_c0);
          sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
          std::__cxx11::to_string((__cxx11 *)&i,sVar3);
          ::std::operator+(local_80,local_a0);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_60,(char *)local_80);
          ::std::__cxx11::string::~string((string *)local_80);
          ::std::__cxx11::string::~string((string *)&i);
          ::std::__cxx11::string::~string((string *)local_a0);
          ::std::__cxx11::string::~string(local_c0);
          ::std::__cxx11::string::~string((string *)local_e0);
          PushError(this,(string *)local_60);
          this_local._7_1_ = false;
          msg.field_2._12_4_ = 1;
          ::std::__cxx11::string::~string((string *)local_60);
        }
      }
      else {
        this_local._7_1_ = false;
        msg.field_2._12_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = false;
      msg.field_2._12_4_ = 1;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseBasicTypeTuple(std::array<T, N> *result) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<T> values;
  if (!SepBy1BasicType<T>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != N) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(N) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PushError(msg);
    return false;
  }

  for (size_t i = 0; i < N; i++) {
    (*result)[i] = values[i];
  }

  return true;
}